

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

CBString *
insydeFlashDeviceMapEntryTypeGuidToUString(CBString *__return_storage_ptr__,EFI_GUID *guid)

{
  int iVar1;
  char *s;
  UByteArray baGuid;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,guid,guid + 1);
  if (local_40 == INSYDE_FLASH_MAP_REGION_BOOT_FV_GUID.d._M_string_length) {
    s = "Boot Firmare Volume";
    if (local_40 != 0) {
      iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_BOOT_FV_GUID.d._M_dataplus._M_p,local_40);
      if (iVar1 != 0) goto LAB_00110664;
    }
  }
  else {
LAB_00110664:
    if (local_40 == INSYDE_FLASH_MAP_REGION_BVDT_GUID.d._M_string_length) {
      s = "BIOS Version Data Table";
      if (local_40 != 0) {
        iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_BVDT_GUID.d._M_dataplus._M_p,local_40);
        if (iVar1 != 0) goto LAB_00110698;
      }
    }
    else {
LAB_00110698:
      if (local_40 == INSYDE_FLASH_MAP_REGION_EC_GUID.d._M_string_length) {
        s = "EC Firmware";
        if (local_40 != 0) {
          iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_EC_GUID.d._M_dataplus._M_p,local_40);
          if (iVar1 != 0) goto LAB_001106cc;
        }
      }
      else {
LAB_001106cc:
        if (local_40 == INSYDE_FLASH_MAP_REGION_FTW_BACKUP_GUID.d._M_string_length) {
          s = "FTW Backup";
          if (local_40 != 0) {
            iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_FTW_BACKUP_GUID.d._M_dataplus._M_p,
                         local_40);
            if (iVar1 != 0) goto LAB_00110700;
          }
        }
        else {
LAB_00110700:
          if (local_40 == INSYDE_FLASH_MAP_REGION_FTW_STATE_GUID.d._M_string_length) {
            s = "FTW State";
            if (local_40 != 0) {
              iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_FTW_STATE_GUID.d._M_dataplus._M_p,
                           local_40);
              if (iVar1 != 0) goto LAB_00110734;
            }
          }
          else {
LAB_00110734:
            if (local_40 == INSYDE_FLASH_MAP_REGION_FV_GUID.d._M_string_length) {
              s = "Firmare Volume";
              if (local_40 != 0) {
                iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_FV_GUID.d._M_dataplus._M_p,local_40);
                if (iVar1 != 0) goto LAB_00110768;
              }
            }
            else {
LAB_00110768:
              if (local_40 == INSYDE_FLASH_MAP_REGION_FLASH_DEVICE_MAP_GUID.d._M_string_length) {
                s = "Flash Device Map";
                if (local_40 != 0) {
                  iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_FLASH_DEVICE_MAP_GUID.d._M_dataplus.
                                        _M_p,local_40);
                  if (iVar1 != 0) goto LAB_0011079c;
                }
              }
              else {
LAB_0011079c:
                if (local_40 == INSYDE_FLASH_MAP_REGION_LOGO_GUID.d._M_string_length) {
                  s = "Logo";
                  if (local_40 != 0) {
                    iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_LOGO_GUID.d._M_dataplus._M_p,
                                 local_40);
                    if (iVar1 != 0) goto LAB_001107d0;
                  }
                }
                else {
LAB_001107d0:
                  if (local_40 == INSYDE_FLASH_MAP_REGION_MICROCODE_GUID.d._M_string_length) {
                    s = "Microcode";
                    if (local_40 != 0) {
                      iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_MICROCODE_GUID.d._M_dataplus.
                                            _M_p,local_40);
                      if (iVar1 != 0) goto LAB_00110804;
                    }
                  }
                  else {
LAB_00110804:
                    if (local_40 == INSYDE_FLASH_MAP_REGION_MSDM_TABLE_GUID.d._M_string_length) {
                      s = "MSDM Table";
                      if (local_40 != 0) {
                        iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_MSDM_TABLE_GUID.d._M_dataplus.
                                              _M_p,local_40);
                        if (iVar1 != 0) goto LAB_00110838;
                      }
                    }
                    else {
LAB_00110838:
                      if (local_40 == INSYDE_FLASH_MAP_REGION_MULTI_CONFIG_GUID.d._M_string_length)
                      {
                        s = "MultiConfig";
                        if (local_40 != 0) {
                          iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_MULTI_CONFIG_GUID.d.
                                                _M_dataplus._M_p,local_40);
                          if (iVar1 != 0) goto LAB_0011086c;
                        }
                      }
                      else {
LAB_0011086c:
                        if (local_40 == INSYDE_FLASH_MAP_REGION_VAR_DEFAULT_GUID.d._M_string_length)
                        {
                          s = "Variable Defaults";
                          if (local_40 != 0) {
                            iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_VAR_DEFAULT_GUID.d.
                                                  _M_dataplus._M_p,local_40);
                            if (iVar1 != 0) goto LAB_001108a0;
                          }
                        }
                        else {
LAB_001108a0:
                          if (local_40 ==
                              INSYDE_FLASH_MAP_REGION_SMBIOS_UPDATE_GUID.d._M_string_length) {
                            s = "SMBIOS Update";
                            if (local_40 != 0) {
                              iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_SMBIOS_UPDATE_GUID.d.
                                                    _M_dataplus._M_p,local_40);
                              if (iVar1 != 0) goto LAB_001108d4;
                            }
                          }
                          else {
LAB_001108d4:
                            if (local_40 == INSYDE_FLASH_MAP_REGION_VAR_GUID.d._M_string_length) {
                              s = "Variables";
                              if (local_40 != 0) {
                                iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_VAR_GUID.d._M_dataplus
                                                      ._M_p,local_40);
                                if (iVar1 != 0) goto LAB_00110908;
                              }
                            }
                            else {
LAB_00110908:
                              if (local_40 ==
                                  INSYDE_FLASH_MAP_REGION_UNKNOWN_GUID.d._M_string_length) {
                                s = "Unknown";
                                if (local_40 != 0) {
                                  iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_UNKNOWN_GUID.d.
                                                        _M_dataplus._M_p,local_40);
                                  if (iVar1 != 0) goto LAB_0011093c;
                                }
                              }
                              else {
LAB_0011093c:
                                if (local_40 ==
                                    INSYDE_FLASH_MAP_REGION_UNUSED_GUID.d._M_string_length) {
                                  s = "Unused";
                                  if (local_40 != 0) {
                                    iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_UNUSED_GUID.d.
                                                          _M_dataplus._M_p,local_40);
                                    if (iVar1 != 0) goto LAB_00110970;
                                  }
                                }
                                else {
LAB_00110970:
                                  if (local_40 ==
                                      INSYDE_FLASH_MAP_REGION_USB_OPTION_ROM_GUID.d._M_string_length
                                     ) {
                                    s = "USB Option ROM";
                                    if (local_40 != 0) {
                                      iVar1 = bcmp(local_48,
                                                  INSYDE_FLASH_MAP_REGION_USB_OPTION_ROM_GUID.d.
                                                  _M_dataplus._M_p,local_40);
                                      if (iVar1 != 0) goto LAB_001109a4;
                                    }
                                  }
                                  else {
LAB_001109a4:
                                    if (local_40 ==
                                        INSYDE_FLASH_MAP_REGION_DXE_FV_GUID.d._M_string_length) {
                                      s = "DXE Firmare Volume";
                                      if (local_40 != 0) {
                                        iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_DXE_FV_GUID.d.
                                                              _M_dataplus._M_p,local_40);
                                        if (iVar1 != 0) goto LAB_001109d0;
                                      }
                                    }
                                    else {
LAB_001109d0:
                                      if (local_40 ==
                                          INSYDE_FLASH_MAP_REGION_PEI_FV_GUID.d._M_string_length) {
                                        s = "PEI Firmare Volume";
                                        if (local_40 != 0) {
                                          iVar1 = bcmp(local_48,INSYDE_FLASH_MAP_REGION_PEI_FV_GUID.
                                                                d._M_dataplus._M_p,local_40);
                                          if (iVar1 != 0) goto LAB_001109fc;
                                        }
                                      }
                                      else {
LAB_001109fc:
                                        if (local_40 !=
                                            INSYDE_FLASH_MAP_REGION_UNSIGNED_FV_GUID.d.
                                            _M_string_length) {
LAB_00110a28:
                                          guidToUString(__return_storage_ptr__,guid,true);
                                          goto LAB_00110a45;
                                        }
                                        s = "Unsigned Firmare Volume";
                                        if (local_40 != 0) {
                                          iVar1 = bcmp(local_48,
                                                  INSYDE_FLASH_MAP_REGION_UNSIGNED_FV_GUID.d.
                                                  _M_dataplus._M_p,local_40);
                                          if (iVar1 != 0) goto LAB_00110a28;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Bstrlib::CBString::CBString(__return_storage_ptr__,s);
LAB_00110a45:
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

UString insydeFlashDeviceMapEntryTypeGuidToUString(const EFI_GUID & guid)
{
    const UByteArray baGuid((const char*)&guid, sizeof(EFI_GUID));
    if (baGuid == INSYDE_FLASH_MAP_REGION_BOOT_FV_GUID)          return UString("Boot Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_BVDT_GUID)             return UString("BIOS Version Data Table");
    if (baGuid == INSYDE_FLASH_MAP_REGION_EC_GUID)               return UString("EC Firmware");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FTW_BACKUP_GUID)       return UString("FTW Backup");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FTW_STATE_GUID)        return UString("FTW State");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FV_GUID)               return UString("Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FLASH_DEVICE_MAP_GUID) return UString("Flash Device Map");
    if (baGuid == INSYDE_FLASH_MAP_REGION_LOGO_GUID)             return UString("Logo");
    if (baGuid == INSYDE_FLASH_MAP_REGION_MICROCODE_GUID)        return UString("Microcode");
    if (baGuid == INSYDE_FLASH_MAP_REGION_MSDM_TABLE_GUID)       return UString("MSDM Table");
    if (baGuid == INSYDE_FLASH_MAP_REGION_MULTI_CONFIG_GUID)     return UString("MultiConfig");
    if (baGuid == INSYDE_FLASH_MAP_REGION_VAR_DEFAULT_GUID)      return UString("Variable Defaults");
    if (baGuid == INSYDE_FLASH_MAP_REGION_SMBIOS_UPDATE_GUID)    return UString("SMBIOS Update");
    if (baGuid == INSYDE_FLASH_MAP_REGION_VAR_GUID)              return UString("Variables");
    if (baGuid == INSYDE_FLASH_MAP_REGION_UNKNOWN_GUID)          return UString("Unknown");
    if (baGuid == INSYDE_FLASH_MAP_REGION_UNUSED_GUID)           return UString("Unused");
    if (baGuid == INSYDE_FLASH_MAP_REGION_USB_OPTION_ROM_GUID)   return UString("USB Option ROM");
    if (baGuid == INSYDE_FLASH_MAP_REGION_DXE_FV_GUID)           return UString("DXE Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_PEI_FV_GUID)           return UString("PEI Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_UNSIGNED_FV_GUID)      return UString("Unsigned Firmare Volume");
    return guidToUString(guid);
}